

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.hpp
# Opt level: O2

void * __thiscall tcmalloc::ThreadCache::Alloc(ThreadCache *this,size_t size,uint64_t cl)

{
  long lVar1;
  bool bVar2;
  ThreadCacheFreeList *this_00;
  void *rv;
  
  if (cl - 1 < 0x55) {
    this_00 = this->freelists_ + cl;
    bVar2 = ThreadCacheFreeList::TryPop(this_00,&rv);
    if (!bVar2) {
      FetchFromCentralCache(this,this_00);
      ThreadCacheFreeList::TryPop(this_00,&rv);
    }
    lVar1 = (&SizeClasses)[cl * 3];
    this->size_ = this->size_ - lVar1;
    this->total_alloc_ = this->total_alloc_ + lVar1;
    return rv;
  }
  __assert_fail("0 < cl && cl < kMaxClass",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/thread_cache.hpp"
                ,0x25,"void *tcmalloc::ThreadCache::Alloc(size_t, uint64_t)");
}

Assistant:

void* Alloc(size_t size, uint64_t cl) {
        assert(0 < cl && cl < kMaxClass);
        void* rv;
        if (!freelists_[cl].TryPop(&rv)) {
            FetchFromCentralCache(freelists_[cl]);
            freelists_[cl].TryPop(&rv);
        }
        size = ClassSize(cl);
        size_ -= size;
        total_alloc_ += size;
        return rv;
    }